

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Expression>_>_>::dispose
          (Array<kj::Maybe<capnp::Orphan<capnp::compiler::Expression>_>_> *this)

{
  Maybe<capnp::Orphan<capnp::compiler::Expression>_> *firstElement;
  size_t elementCount;
  size_t sizeCopy;
  Maybe<capnp::Orphan<capnp::compiler::Expression>_> *ptrCopy;
  Array<kj::Maybe<capnp::Orphan<capnp::compiler::Expression>_>_> *this_local;
  
  firstElement = this->ptr;
  elementCount = this->size_;
  if (firstElement != (Maybe<capnp::Orphan<capnp::compiler::Expression>_> *)0x0) {
    this->ptr = (Maybe<capnp::Orphan<capnp::compiler::Expression>_> *)0x0;
    this->size_ = 0;
    ArrayDisposer::dispose<kj::Maybe<capnp::Orphan<capnp::compiler::Expression>>>
              (this->disposer,firstElement,elementCount,elementCount);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }